

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.H
# Opt level: O0

void __thiscall amrex::AmrMesh::AmrMesh(AmrMesh *this,AmrMesh *rhs)

{
  AmrInfo *in_RSI;
  AmrInfo *in_RDI;
  
  AmrInfo::AmrInfo(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR__AmrMesh_01aa49b8;
  in_RDI[1].max_level = in_RSI[1].max_level;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_RSI,
             (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_RDI);
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::Vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             in_RSI,(Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     *)in_RDI);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_RSI,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_RDI);
  in_RDI[1].n_error_buf.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start =
       in_RSI[1].n_error_buf.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
       super__Vector_impl_data._M_start;
  return;
}

Assistant:

AmrMesh (AmrMesh&& rhs) = default;